

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_sse4.c
# Opt level: O3

uint aom_highbd_obmc_sad128x128_sse4_1(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar11 [16];
  
  lVar5 = (long)pre * 2;
  auVar7 = (undefined1  [16])0x0;
  auVar8 = pmovsxwd(in_XMM1,0x800080008000800);
  uVar3 = 8;
  do {
    auVar9 = pmovzxwd(in_XMM2,*(undefined8 *)(lVar5 + -8 + uVar3 * 2));
    piVar1 = wsrc + (uVar3 - 8);
    piVar2 = wsrc + (uVar3 - 4);
    auVar11 = pmovzxwd(in_XMM5,*(undefined8 *)(lVar5 + -0x10 + uVar3 * 2));
    in_XMM5 = pmaddwd(auVar11,*(undefined1 (*) [16])(mask + (uVar3 - 8)));
    auVar9 = pmaddwd(auVar9,*(undefined1 (*) [16])(mask + (uVar3 - 4)));
    auVar11._0_4_ = *piVar1 - in_XMM5._0_4_;
    auVar11._4_4_ = piVar1[1] - in_XMM5._4_4_;
    auVar11._8_4_ = piVar1[2] - in_XMM5._8_4_;
    auVar11._12_4_ = piVar1[3] - in_XMM5._12_4_;
    auVar10._0_4_ = *piVar2 - auVar9._0_4_;
    auVar10._4_4_ = piVar2[1] - auVar9._4_4_;
    auVar10._8_4_ = piVar2[2] - auVar9._8_4_;
    auVar10._12_4_ = piVar2[3] - auVar9._12_4_;
    auVar9 = pabsd(auVar9,auVar11);
    in_XMM2._0_4_ = ((uint)(auVar9._0_4_ + auVar8._0_4_) >> 0xc) + auVar7._0_4_;
    in_XMM2._4_4_ = ((uint)(auVar9._4_4_ + auVar8._4_4_) >> 0xc) + auVar7._4_4_;
    in_XMM2._8_4_ = ((uint)(auVar9._8_4_ + auVar8._8_4_) >> 0xc) + auVar7._8_4_;
    in_XMM2._12_4_ = ((uint)(auVar9._12_4_ + auVar8._12_4_) >> 0xc) + auVar7._12_4_;
    auVar9 = pabsd(auVar7,auVar10);
    auVar7._0_4_ = ((uint)(auVar9._0_4_ + auVar8._0_4_) >> 0xc) + in_XMM2._0_4_;
    auVar7._4_4_ = ((uint)(auVar9._4_4_ + auVar8._4_4_) >> 0xc) + in_XMM2._4_4_;
    auVar7._8_4_ = ((uint)(auVar9._8_4_ + auVar8._8_4_) >> 0xc) + in_XMM2._8_4_;
    auVar7._12_4_ = ((uint)(auVar9._12_4_ + auVar8._12_4_) >> 0xc) + in_XMM2._12_4_;
    lVar6 = 0;
    if ((uVar3 & 0x78) == 0) {
      lVar6 = (long)(pre_stride + -0x80);
    }
    lVar5 = lVar5 + lVar6 * 2;
    uVar4 = uVar3 - 8;
    uVar3 = uVar3 + 8;
  } while (uVar4 < 0x3ff8);
  auVar7 = phaddd(auVar7,auVar7);
  auVar7 = phaddd(auVar7,auVar7);
  return auVar7._0_4_;
}

Assistant:

static AOM_FORCE_INLINE unsigned int hbd_obmc_sad_w8n(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, const int width, const int height) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - width;
  int n = 0;
  __m128i v_sad_d = _mm_setzero_si128();

  assert(width >= 8);
  assert(IS_POWER_OF_TWO(width));

  do {
    const __m128i v_p1_w = xx_loadl_64(pre + n + 4);
    const __m128i v_m1_d = xx_load_128(mask + n + 4);
    const __m128i v_w1_d = xx_load_128(wsrc + n + 4);
    const __m128i v_p0_w = xx_loadl_64(pre + n);
    const __m128i v_m0_d = xx_load_128(mask + n);
    const __m128i v_w0_d = xx_load_128(wsrc + n);

    const __m128i v_p0_d = _mm_cvtepu16_epi32(v_p0_w);
    const __m128i v_p1_d = _mm_cvtepu16_epi32(v_p1_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm0_d = _mm_madd_epi16(v_p0_d, v_m0_d);
    const __m128i v_pm1_d = _mm_madd_epi16(v_p1_d, v_m1_d);

    const __m128i v_diff0_d = _mm_sub_epi32(v_w0_d, v_pm0_d);
    const __m128i v_diff1_d = _mm_sub_epi32(v_w1_d, v_pm1_d);
    const __m128i v_absdiff0_d = _mm_abs_epi32(v_diff0_d);
    const __m128i v_absdiff1_d = _mm_abs_epi32(v_diff1_d);

    // Rounded absolute difference
    const __m128i v_rad0_d = xx_roundn_epu32(v_absdiff0_d, 12);
    const __m128i v_rad1_d = xx_roundn_epu32(v_absdiff1_d, 12);

    v_sad_d = _mm_add_epi32(v_sad_d, v_rad0_d);
    v_sad_d = _mm_add_epi32(v_sad_d, v_rad1_d);

    n += 8;

    if (n % width == 0) pre += pre_step;
  } while (n < width * height);

  return xx_hsum_epi32_si32(v_sad_d);
}